

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

int __thiscall TPZGaussRule::ComputingGaussLegendreQuadrature(TPZGaussRule *this,int order)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  TPZVec<long_double> *in_stack_00000138;
  TPZVec<long_double> *in_stack_00000140;
  int *in_stack_00000148;
  TPZGaussRule *in_stack_00000150;
  
  *(int *)(in_RDI + 4) = (int)((double)(in_ESI + 2) * 0.51);
  if (*(int *)(in_RDI + 4) < 1) {
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  if (1000 < *(int *)(in_RDI + 4)) {
    *(undefined4 *)(in_RDI + 4) = 999;
  }
  iVar1 = *(int *)(in_RDI + 4);
  ComputingGaussLegendreQuadrature
            (in_stack_00000150,in_stack_00000148,in_stack_00000140,in_stack_00000138);
  return (iVar1 + -1) * 2;
}

Assistant:

int TPZGaussRule::ComputingGaussLegendreQuadrature(int order) {
	// Computing number of points appropriated to the wished order = 2*npoints - 1. Note: If odd we need increment one point more
	fNumInt = (int)(0.51*(order+2));
	if(fNumInt < 1)
		fNumInt = 1;
	if(fNumInt > TPZGaussRule::NRULESLEGENDRE_ORDER) 
		fNumInt = TPZGaussRule::NRULESLEGENDRE_ORDER-1;

    order = (fNumInt-1)*2;
	ComputingGaussLegendreQuadrature(&fNumInt,fLocation,fWeight);
    return order;
}